

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

bool __thiscall cmGlobalNinjaMultiGenerator::OpenBuildFileStreams(cmGlobalNinjaMultiGenerator *this)

{
  string *config;
  bool bVar1;
  ostream *poVar2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  long lVar3;
  long lVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  cmGlobalNinjaMultiGenerator *local_58;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,NINJA_COMMON_FILE,(allocator<char> *)&local_58);
  bVar1 = cmGlobalNinjaGenerator::OpenFileStream
                    (&this->super_cmGlobalNinjaGenerator,&this->CommonFileStream,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    return false;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,cmGlobalNinjaGenerator::NINJA_BUILD_FILE,
             (allocator<char> *)&local_58);
  bVar1 = cmGlobalNinjaGenerator::OpenFileStream
                    (&this->super_cmGlobalNinjaGenerator,&this->DefaultFileStream,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    return false;
  }
  poVar2 = std::operator<<((ostream *)
                           (this->DefaultFileStream)._M_t.
                           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                           "# Build using rules for \'");
  config = &(this->super_cmGlobalNinjaGenerator).DefaultFileConfig;
  poVar2 = std::operator<<(poVar2,(string *)config);
  poVar2 = std::operator<<(poVar2,"\'.\n\n");
  poVar2 = std::operator<<(poVar2,"include ");
  GetNinjaImplFilename(&local_50,config);
  poVar2 = std::operator<<(poVar2,(string *)&local_50);
  std::operator<<(poVar2,"\n\n");
  std::__cxx11::string::~string((string *)&local_50);
  std::operator<<((ostream *)
                  (this->CommonFileStream)._M_t.
                  super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                  .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                  "# This file contains build statements common to all configurations.\n\n");
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_50,
             (cmMakefile *)
             (((this->super_cmGlobalNinjaGenerator).super_cmGlobalCommonGenerator.
               super_cmGlobalGenerator.Makefiles.
               super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t,
             IncludeEmptyConfig);
  lVar4 = local_50._M_string_length - (long)local_50._M_dataplus._M_p;
  __it._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_50._M_dataplus._M_p;
  local_58 = this;
  for (lVar3 = lVar4 >> 7; 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar1 = __gnu_cxx::__ops::_Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::$_0>
            ::operator()((_Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::__0> *)
                         &local_58,__it);
    _Var5._M_current = __it._M_current;
    if (bVar1) goto LAB_0034992a;
    bVar1 = __gnu_cxx::__ops::_Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::$_0>
            ::operator()((_Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::__0> *)
                         &local_58,__it._M_current + 1);
    _Var5._M_current = __it._M_current + 1;
    if (bVar1) goto LAB_0034992a;
    bVar1 = __gnu_cxx::__ops::_Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::$_0>
            ::operator()((_Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::__0> *)
                         &local_58,__it._M_current + 2);
    _Var5._M_current = __it._M_current + 2;
    if (bVar1) goto LAB_0034992a;
    bVar1 = __gnu_cxx::__ops::_Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::$_0>
            ::operator()((_Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::__0> *)
                         &local_58,__it._M_current + 3);
    _Var5._M_current = __it._M_current + 3;
    if (bVar1) goto LAB_0034992a;
    __it._M_current = __it._M_current + 4;
    lVar4 = lVar4 + -0x80;
  }
  lVar4 = lVar4 >> 5;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      _Var5._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           local_50._M_string_length;
      if ((lVar4 != 3) ||
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::$_0>::operator()
                            ((_Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::__0>
                              *)&local_58,__it), _Var5._M_current = __it._M_current, bVar1))
      goto LAB_0034992a;
      __it._M_current = __it._M_current + 1;
    }
    bVar1 = __gnu_cxx::__ops::_Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::$_0>
            ::operator()((_Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::__0> *)
                         &local_58,__it);
    _Var5._M_current = __it._M_current;
    if (bVar1) goto LAB_0034992a;
    __it._M_current = __it._M_current + 1;
  }
  bVar1 = __gnu_cxx::__ops::_Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::$_0>::
          operator()((_Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::__0> *)
                     &local_58,__it);
  _Var5._M_current = __it._M_current;
  if (!bVar1) {
    _Var5._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         local_50._M_string_length;
  }
LAB_0034992a:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_50);
  return _Var5._M_current ==
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         local_50._M_string_length;
}

Assistant:

bool cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()
{
  if (!this->OpenFileStream(this->CommonFileStream,
                            cmGlobalNinjaMultiGenerator::NINJA_COMMON_FILE)) {
    return false;
  }

  if (!this->OpenFileStream(this->DefaultFileStream, NINJA_BUILD_FILE)) {
    return false;
  }
  *this->DefaultFileStream << "# Build using rules for '"
                           << this->DefaultFileConfig << "'.\n\n"
                           << "include "
                           << GetNinjaImplFilename(this->DefaultFileConfig)
                           << "\n\n";

  // Write a comment about this file.
  *this->CommonFileStream
    << "# This file contains build statements common to all "
       "configurations.\n\n";

  auto const& configs =
    this->Makefiles[0]->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);
  return std::all_of(
    configs.begin(), configs.end(), [this](std::string const& config) -> bool {
      // Open impl file.
      if (!this->OpenFileStream(this->ImplFileStreams[config],
                                GetNinjaImplFilename(config))) {
        return false;
      }

      // Write a comment about this file.
      *this->ImplFileStreams[config]
        << "# This file contains build statements specific to the \"" << config
        << "\"\n# configuration.\n\n";

      // Open config file.
      if (!this->OpenFileStream(this->ConfigFileStreams[config],
                                GetNinjaConfigFilename(config))) {
        return false;
      }

      // Write a comment about this file.
      *this->ConfigFileStreams[config]
        << "# This file contains aliases specific to the \"" << config
        << "\"\n# configuration.\n\n"
        << "include " << GetNinjaImplFilename(config) << "\n\n";

      return true;
    });
}